

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

FileDescriptorProto * __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name)

{
  bool bVar1;
  const_iterator cVar2;
  StringPiece local_40;
  StringPiece local_30;
  
  cVar2 = (anonymous_namespace)::
          FindLastLessOrEqual<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>,std::__cxx11::string>
                    (&this->by_symbol_,name);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header) {
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (cVar2._M_node + 1));
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_40,name);
    bVar1 = anon_unknown_31::IsSubSymbol(local_30,local_40);
    if (bVar1) {
      return *(FileDescriptorProto **)(cVar2._M_node + 2);
    }
  }
  return (FileDescriptorProto *)0x0;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindSymbol(
    const std::string& name) {
  auto iter = FindLastLessOrEqual(&by_symbol_, name);

  return (iter != by_symbol_.end() && IsSubSymbol(iter->first, name))
             ? iter->second
             : Value();
}